

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  TestCase *pTVar1;
  ostream *poVar2;
  pointer ppTVar3;
  int width;
  size_t i;
  long lVar4;
  size_t i_1;
  ulong uVar5;
  int value;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string kIndent;
  string kTestsuites;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuites,"testsuites",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  ppTVar3 = (test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  value = 0;
  for (lVar4 = 0;
      (long)(test_cases->
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    pTVar1 = ppTVar3[lVar4];
    value = value + (int)((ulong)((long)*(pointer *)
                                         ((long)&(pTVar1->test_info_list_).
                                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                 ._M_impl + 8) -
                                 *(long *)&(pTVar1->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data) >> 3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"tests",(allocator<char> *)&local_40);
  OutputJsonKey(stream,&kTestsuites,&local_a0,value,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"name",&local_a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"AllTests",&local_a2);
  OutputJsonKey(stream,&kTestsuites,&local_a0,&local_40,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  poVar2 = std::operator<<(stream,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)&kTestsuites);
  std::operator<<(poVar2,"\": [\n");
  for (uVar5 = 0;
      ppTVar3 = (test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(test_cases->
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
      uVar5 = uVar5 + 1) {
    if (uVar5 != 0) {
      std::operator<<(stream,",\n");
      ppTVar3 = (test_cases->
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    PrintJsonTestCase(stream,ppTVar3[uVar5]);
  }
  poVar2 = std::operator<<(stream,"\n");
  poVar2 = std::operator<<(poVar2,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"]\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestCase*>& test_cases) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (size_t i = 0; i < test_cases.size(); ++i) {
    total_tests += test_cases[i]->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_cases.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestCase(stream, *test_cases[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}